

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O3

void melee_effect_elemental(melee_effect_handler_context_t *context,wchar_t type,_Bool pure_element)

{
  wchar_t wVar1;
  wchar_t wVar2;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,pure_element) != 0) {
    context->obvious = true;
  }
  if ((uint)type < 4 && context->p != (player *)0x0) {
    msg(&DAT_00266ac4 + *(int *)(&DAT_00266ac4 + (ulong)(uint)type * 4));
  }
  wVar1 = adjust_dam_armor(context->damage,context->ac + L'2');
  if (context->method->phys == false) {
    wVar1 = L'\0';
  }
  if (context->p == (player *)0x0) {
    if (context->t_mon != (monster_conflict *)0x0) {
      get_lore(context->t_mon->race);
      (*(code *)(&DAT_00266ab0 + *(int *)(&DAT_00266ab0 + (ulong)(uint)type * 4)))();
      return;
    }
    __assert_fail("context->t_mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-blows.c"
                  ,0x1c4,"void melee_effect_elemental(melee_effect_handler_context_t *, int, _Bool)"
                 );
  }
  wVar2 = adjust_dam(context->p,type,context->damage,RANDOMISE,L'\0',true);
  if (wVar1 <= wVar2) {
    wVar1 = wVar2;
  }
  context->damage = wVar1;
  if ((context->p != (player *)0x0) && (L'\0' < wVar2)) {
    wVar1 = L'Ĭ';
    if ((uint)(wVar2 * 5) < 300) {
      wVar1 = wVar2 * 5;
    }
    inven_damage(context->p,type,wVar1);
    wVar1 = context->damage;
  }
  if (L'\0' < wVar1) {
    if (context->p == (player *)0x0) {
      if (context->t_mon == (monster_conflict *)0x0) {
        __assert_fail("context->t_mon",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-blows.c"
                      ,0x1dc,
                      "void melee_effect_elemental(melee_effect_handler_context_t *, int, _Bool)");
      }
      display_blow_message_vs_monster(context->method,context->m_name,context->t_mon->midx);
      mon_take_nonplayer_hit(context->damage,context->t_mon,MON_MSG_NONE,MON_MSG_DIE);
    }
    else {
      wVar1 = player_apply_damage_reduction(context->p,wVar1);
      display_blow_message_vs_player(context->method,context->m_name,context->p,wVar1);
      take_hit(context->p,wVar1,context->ddesc);
    }
  }
  if ((pure_element) && (context->p != (player *)0x0)) {
    update_smart_learn(context->mon,context->p,L'\0',L'\0',type);
    return;
  }
  return;
}

Assistant:

static void melee_effect_elemental(melee_effect_handler_context_t *context,
								   int type, bool pure_element)
{
	int physical_dam, elemental_dam;
	enum mon_messages hurt_msg = MON_MSG_NONE;
	enum mon_messages die_msg = MON_MSG_DIE;

	if (pure_element)
		/* Obvious */
		context->obvious = true;

	if (context->p) {
		switch (type) {
			case PROJ_ACID: msg("You are covered in acid!");
				break;
			case PROJ_ELEC: msg("You are struck by electricity!");
				break;
			case PROJ_FIRE: msg("You are enveloped in flames!");
				break;
			case PROJ_COLD: msg("You are covered with frost!");
				break;
		}
	}

	/* Give a small bonus to ac for elemental attacks */
	physical_dam = adjust_dam_armor(context->damage, context->ac + 50);

	/* Some attacks do no physical damage */
	if (!context->method->phys)
		physical_dam = 0;

	if (context->p) {
		elemental_dam = adjust_dam(context->p, type, context->damage,
								   RANDOMISE, 0, true);
	} else {
		assert(context->t_mon);
		elemental_dam = monster_elemental_damage(context, type, &hurt_msg,
												 &die_msg);
	}

	/* Take the larger of physical or elemental damage */
	context->damage = (physical_dam > elemental_dam) ?
		physical_dam : elemental_dam;

	if (context->p && elemental_dam > 0)
		inven_damage(context->p, type, MIN(elemental_dam * 5, 300));
	if (context->damage > 0) {
		if (context->p) {
			/*
			 * Player damage reduction does not affect the damage]				 * used for side effect calculations so leave
			 * context->damage as is.
			 */
			int reduced = player_apply_damage_reduction(context->p,
				context->damage);

			display_blow_message_vs_player(context->method,
				context->m_name, context->p, reduced);
			take_hit(context->p, reduced, context->ddesc);
		} else {
			assert(context->t_mon);
			display_blow_message_vs_monster(context->method,
				context->m_name, context->t_mon->midx);
			(void) mon_take_nonplayer_hit(context->damage,
				context->t_mon, hurt_msg, die_msg);
		}
	}

	/* Learn about the player */
	if (pure_element && context->p) {
		update_smart_learn(context->mon, context->p, 0, 0, type);
	}
}